

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::iterationAnalysis(HEkkDual *this)

{
  long in_RDI;
  HEkkDual *unaff_retaddr;
  bool switch_to_devex;
  bool make_iteration_report;
  HEkk *in_stack_00000040;
  undefined5 in_stack_fffffffffffffff0;
  bool bVar1;
  undefined1 in_stack_fffffffffffffff6;
  
  bVar1 = false;
  if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf2) & 1) != 0) {
    bVar1 = 2 < *(int *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x208);
  }
  if (bVar1 != false) {
    HEkk::computeInfeasibilitiesForReporting
              ((HEkk *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffff6,
                                               CONCAT15(bVar1,in_stack_fffffffffffffff0))),
               (SimplexAlgorithm)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  }
  iterationAnalysisData(unaff_retaddr);
  HighsSimplexAnalysis::iterationReport((HighsSimplexAnalysis *)unaff_retaddr);
  if ((*(int *)(in_RDI + 0xac) == 2) && (bVar1 = HEkk::switchToDevex(in_stack_00000040), bVar1)) {
    *(undefined4 *)(in_RDI + 0xac) = 1;
    initialiseDevexFramework(this);
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
    HighsSimplexAnalysis::iterationRecord((HighsSimplexAnalysis *)this);
  }
  return;
}

Assistant:

void HEkkDual::iterationAnalysis() {
  // Compute the infeasibility data (expensive) if analysing run-time
  // data and the log level is at least kIterationReportLogType
  // (Verbose)
  const bool make_iteration_report = analysis->analyse_simplex_runtime_data &&
                                     ekk_instance_.options_->log_dev_level >=
                                         (HighsInt)kIterationReportLogType;
  if (make_iteration_report)
    ekk_instance_.computeInfeasibilitiesForReporting(SimplexAlgorithm::kDual,
                                                     solve_phase);
  // Possibly report on the iteration
  iterationAnalysisData();
  analysis->iterationReport();

  // Possibly switch from DSE to Devex
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    const bool switch_to_devex = ekk_instance_.switchToDevex();
    if (switch_to_devex) {
      edge_weight_mode = EdgeWeightMode::kDevex;
      initialiseDevexFramework();
    }
  }
  if (analysis->analyse_simplex_summary_data) analysis->iterationRecord();
}